

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPUDPv4Transmitter::PollSocket(RTPUDPv4Transmitter *this,bool rtp)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  ssize_t sVar5;
  RTPMemoryManager *pRVar6;
  RTPIPv4Address *this_00;
  uint8_t *data;
  RTPRawPacket *this_01;
  uint8_t packettype;
  RTCPCommonHeader *rtcpheader;
  bool isrtp;
  uint8_t *datacopy;
  RTPIPv4Address *addr;
  RTPRawPacket *pack;
  RTPTime RStack_10060;
  bool acceptdata;
  RTPTime curtime;
  int8_t iStack_10046;
  bool bStack_10045;
  int status;
  int8_t isset;
  uint32_t uStack_10040;
  bool dataavailable;
  sockaddr_in srcaddr;
  int sock;
  size_t len;
  char packetbuffer [65535];
  socklen_t local_20;
  int recvlen;
  uint fromlen;
  bool rtp_local;
  RTPUDPv4Transmitter *this_local;
  
  recvlen._3_1_ = rtp;
  _fromlen = this;
  if (rtp) {
    srcaddr.sin_zero._0_4_ = this->rtpsock;
  }
  else {
    srcaddr.sin_zero._0_4_ = this->rtcpsock;
  }
  do {
    stack0xfffffffffffeffd0 = 0;
    ioctl(srcaddr.sin_zero._0_4_,0x541b,srcaddr.sin_zero + 4);
    if (stack0xfffffffffffeffd0 == 0) {
      iStack_10046 = '\0';
      RTPTime::RTPTime(&curtime,0.0);
      iVar2 = RTPSelect((SocketType *)srcaddr.sin_zero,&iStack_10046,1,curtime);
      if (iVar2 < 0) {
        return iVar2;
      }
      bStack_10045 = iStack_10046 != '\0';
    }
    else {
      bStack_10045 = true;
    }
    if (bStack_10045 != false) {
      RStack_10060 = RTPTime::CurrentTime();
      local_20 = 0x10;
      sVar5 = recvfrom(srcaddr.sin_zero._0_4_,&len,0xffff,0,(sockaddr *)&status,&local_20);
      uVar3 = (uint)sVar5;
      if (0 < (int)uVar3) {
        if (this->receivemode == AcceptAll) {
          pack._7_1_ = true;
        }
        else {
          uVar4 = ntohl(uStack_10040);
          uVar1 = ntohs(status._2_2_);
          pack._7_1_ = ShouldAcceptData(this,uVar4,uVar1);
        }
        if ((bool)pack._7_1_ != false) {
          pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          this_00 = (RTPIPv4Address *)operator_new(0x18,pRVar6,0x17);
          uVar4 = ntohl(uStack_10040);
          uVar1 = ntohs(status._2_2_);
          RTPIPv4Address::RTPIPv4Address(this_00,uVar4,uVar1,false);
          if (this_00 == (RTPIPv4Address *)0x0) {
            return -1;
          }
          pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          iVar2 = 2;
          if ((recvlen._3_1_ & 1) != 0) {
            iVar2 = 1;
          }
          data = (uint8_t *)operator_new__((long)(int)uVar3,pRVar6,iVar2);
          if (data == (uint8_t *)0x0) {
            pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
            RTPDelete<jrtplib::RTPIPv4Address>(this_00,pRVar6);
            return -1;
          }
          memcpy(data,&len,(long)(int)uVar3);
          rtcpheader._3_1_ = (bool)(recvlen._3_1_ & 1);
          if ((((this->rtpsock == this->rtcpsock) && (rtcpheader._3_1_ = true, 4 < uVar3)) &&
              (199 < data[1])) && (data[1] < 0xcd)) {
            rtcpheader._3_1_ = false;
          }
          pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          this_01 = (RTPRawPacket *)operator_new(0x38,pRVar6,0x1b);
          pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPRawPacket::RTPRawPacket
                    (this_01,data,(long)(int)uVar3,(RTPAddress *)this_00,&stack0xfffffffffffeffa0,
                     rtcpheader._3_1_,pRVar6);
          addr = (RTPIPv4Address *)this_01;
          if (this_01 == (RTPRawPacket *)0x0) {
            pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
            RTPDelete<jrtplib::RTPIPv4Address>(this_00,pRVar6);
            pRVar6 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
            RTPDeleteByteArray(data,pRVar6);
            return -1;
          }
          std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
          push_back(&this->rawpacketlist,(value_type *)&addr);
        }
      }
    }
    if ((bStack_10045 & 1U) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int RTPUDPv4Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV4TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	do
	{
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			// An alternative workaround would be to just use non-blocking sockets.
			// However, since the user does have access to the sockets and I do not
			// know how this would affect anyone else's code, I chose to do it using
			// an extra select call in case ioctl says the length is zero.
			
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			fromlen = sizeof(struct sockaddr_in);
			recvlen = recvfrom(sock,packetbuffer,RTPUDPV4TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
			if (recvlen > 0)
			{
				bool acceptdata;

				// got data, process it
				if (receivemode == RTPTransmitter::AcceptAll)
					acceptdata = true;
				else
					acceptdata = ShouldAcceptData(ntohl(srcaddr.sin_addr.s_addr),ntohs(srcaddr.sin_port));
				
				if (acceptdata)
				{
					RTPRawPacket *pack;
					RTPIPv4Address *addr;
					uint8_t *datacopy;

					addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv4Address(ntohl(srcaddr.sin_addr.s_addr),ntohs(srcaddr.sin_port));
					if (addr == 0)
						return ERR_RTP_OUTOFMEM;
					datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
					if (datacopy == 0)
					{
						RTPDelete(addr,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(datacopy,packetbuffer,recvlen);
					
					bool isrtp = rtp;
					if (rtpsock == rtcpsock) // check payload type when multiplexing
					{
						isrtp = true;

						if ((size_t)recvlen > sizeof(RTCPCommonHeader))
						{
							RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)datacopy;
							uint8_t packettype = rtcpheader->packettype;

    						if (packettype >= 200 && packettype <= 204)
								isrtp = false;
						}
					}
						
					pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,isrtp,GetMemoryManager());
					if (pack == 0)
					{
						RTPDelete(addr,GetMemoryManager());
						RTPDeleteByteArray(datacopy,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					rawpacketlist.push_back(pack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}